

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::MergeFrom(MapFieldBase *this,MapFieldBase *other)

{
  UntypedMapBase *this_00;
  UntypedMapBase *other_00;
  MapFieldBase *other_local;
  MapFieldBase *this_local;
  
  this_00 = MapFieldBaseForParse::MutableMap(&this->super_MapFieldBaseForParse);
  other_00 = MapFieldBaseForParse::GetMap(&other->super_MapFieldBaseForParse);
  UntypedMapBase::UntypedMergeFrom(this_00,other_00);
  return;
}

Assistant:

void MapFieldBase::MergeFrom(const MapFieldBase& other) {
  MutableMap()->UntypedMergeFrom(other.GetMap());
}